

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

i16 sqlite3TableColumnToStorage(Table *pTab,i16 iCol)

{
  short local_22;
  int local_20;
  i16 n;
  int i;
  i16 iCol_local;
  Table *pTab_local;
  
  pTab_local._6_2_ = iCol;
  if (((pTab->tabFlags & 0x20) != 0) && (-1 < iCol)) {
    local_22 = 0;
    for (local_20 = 0; local_20 < iCol; local_20 = local_20 + 1) {
      if ((pTab->aCol[local_20].colFlags & 0x20) == 0) {
        local_22 = local_22 + 1;
      }
    }
    if ((pTab->aCol[local_20].colFlags & 0x20) == 0) {
      pTab_local._6_2_ = local_22;
    }
    else {
      pTab_local._6_2_ = (pTab->nNVCol + (short)local_20) - local_22;
    }
  }
  return pTab_local._6_2_;
}

Assistant:

SQLITE_PRIVATE i16 sqlite3TableColumnToStorage(Table *pTab, i16 iCol){
  int i;
  i16 n;
  assert( iCol<pTab->nCol );
  if( (pTab->tabFlags & TF_HasVirtual)==0 || iCol<0 ) return iCol;
  for(i=0, n=0; i<iCol; i++){
    if( (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0 ) n++;
  }
  if( pTab->aCol[i].colFlags & COLFLAG_VIRTUAL ){
    /* iCol is a virtual column itself */
    return pTab->nNVCol + i - n;
  }else{
    /* iCol is a normal or stored column */
    return n;
  }
}